

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::trainThread(FastText *this,int32_t threadId)

{
  bool bVar1;
  int32_t iVar2;
  element_type *peVar3;
  minstd_rand *rng;
  element_type *this_00;
  State *pSVar4;
  __int_type_conflict _Var5;
  int in_ESI;
  long in_RDI;
  float lr_00;
  float fVar6;
  float fVar7;
  EncounteredNaNError *anon_var_0;
  real lr;
  real progress;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  int64_t localTokenCount;
  int64_t ntokens;
  State state;
  ifstream ifs;
  real in_stack_fffffffffffffcac;
  State *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  int32_t in_stack_fffffffffffffcbc;
  int32_t in_stack_fffffffffffffcc0;
  real in_stack_fffffffffffffcc4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcc8;
  int32_t in_stack_fffffffffffffcd4;
  undefined8 in_stack_fffffffffffffcd8;
  State *state_00;
  undefined4 in_stack_fffffffffffffce0;
  int iVar8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd20;
  istream *in_stack_fffffffffffffd28;
  istream *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  real in_stack_fffffffffffffd44;
  State *in_stack_fffffffffffffd48;
  FastText *in_stack_fffffffffffffd50;
  State *local_298;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda8;
  real in_stack_fffffffffffffdb4;
  State *in_stack_fffffffffffffdb8;
  FastText *in_stack_fffffffffffffdc0;
  undefined1 local_218 [524];
  int local_c;
  
  local_c = in_ESI;
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x194b38);
  std::ifstream::ifstream(local_218,(string *)&peVar3->input,_S_in);
  rng = (minstd_rand *)utils::size((ifstream *)in_stack_fffffffffffffcb0);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x194b91);
  utils::seek((ifstream *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
              CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x194bc1);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x194bd9);
  Matrix::size((Matrix *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
               (int64_t)in_stack_fffffffffffffcb0);
  iVar8 = local_c;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x194c0a);
  Model::State::State((State *)CONCAT44(iVar8,in_stack_fffffffffffffce0),
                      (int32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                      (int32_t)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4);
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x194c3b);
  pSVar4 = (State *)Dictionary::ntokens(this_00);
  local_298 = (State *)0x0;
  state_00 = pSVar4;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x194c70);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x194c7d);
  while (bVar1 = keepTraining((FastText *)
                              CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                              CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)), bVar1)
  {
    _Var5 = std::__atomic_base::operator_cast_to_long
                      ((__atomic_base<long> *)
                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    lr_00 = (float)_Var5;
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x194cbb);
    fVar6 = lr_00 / (float)((long)peVar3->epoch * (long)pSVar4);
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x194ced);
    fVar7 = (float)(peVar3->lr * (1.0 - (double)fVar6));
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x194d26);
    if (peVar3->model == sup) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x194d41);
      iVar2 = Dictionary::getLine((Dictionary *)
                                  CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                  in_stack_fffffffffffffd38,
                                  (vector<int,_std::allocator<int>_> *)CONCAT44(fVar6,fVar7),
                                  (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
      local_298 = (State *)((long)&local_298->lossValue_ + (long)iVar2);
      supervised((FastText *)CONCAT44(iVar8,in_stack_fffffffffffffce0),state_00,lr_00,
                 in_stack_fffffffffffffcc8,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    }
    else {
      peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x194e9d);
      if (peVar3->model == cbow) {
        std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x194eb4);
        in_stack_fffffffffffffcc0 =
             Dictionary::getLine((Dictionary *)CONCAT44(fVar6,fVar7),in_stack_fffffffffffffd28,
                                 in_stack_fffffffffffffd20,rng);
        local_298 = (State *)((long)&local_298->lossValue_ + (long)in_stack_fffffffffffffcc0);
        cbow(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,
             in_stack_fffffffffffffda8);
      }
      else {
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x194f28);
        if (peVar3->model == sg) {
          std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x194f3f);
          in_stack_fffffffffffffcbc =
               Dictionary::getLine((Dictionary *)CONCAT44(fVar6,fVar7),in_stack_fffffffffffffd28,
                                   in_stack_fffffffffffffd20,rng);
          local_298 = (State *)((long)&local_298->lossValue_ + (long)in_stack_fffffffffffffcbc);
          skipgram(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38);
        }
      }
    }
    in_stack_fffffffffffffcb0 = local_298;
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x194fc1);
    if ((long)peVar3->lrUpdateRate < (long)in_stack_fffffffffffffcb0) {
      std::__atomic_base<long>::operator+=
                ((__atomic_base<long> *)(in_RDI + 0x50),(__int_type_conflict)local_298);
      local_298 = (State *)0x0;
      if ((local_c == 0) &&
         (peVar3 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x19500b), 1 < peVar3->verbose)) {
        in_stack_fffffffffffffcac = Model::State::getLoss((State *)&stack0xfffffffffffffd78);
        std::atomic<float>::operator=
                  ((atomic<float> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      }
    }
  }
  if (local_c == 0) {
    in_stack_fffffffffffffcc4 = Model::State::getLoss((State *)&stack0xfffffffffffffd78);
    std::atomic<float>::operator=
              ((atomic<float> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
  }
  std::ifstream::close();
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  Model::State::~State(in_stack_fffffffffffffcb0);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void FastText::trainThread(int32_t threadId) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model::State state(args_->dim, output_->size(0), threadId + args_->seed);

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  try {
    while (keepTraining(ntokens)) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      real lr = args_->lr * (1.0 - progress);
      if (args_->model == model_name::sup) {
        localTokenCount += dict_->getLine(ifs, line, labels);
        supervised(state, lr, line, labels);
      } else if (args_->model == model_name::cbow) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        cbow(state, lr, line);
      } else if (args_->model == model_name::sg) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        skipgram(state, lr, line);
      }
      if (localTokenCount > args_->lrUpdateRate) {
        tokenCount_ += localTokenCount;
        localTokenCount = 0;
        if (threadId == 0 && args_->verbose > 1) {
          loss_ = state.getLoss();
        }
      }
    }
  } catch (DenseMatrix::EncounteredNaNError&) {
    trainException_ = std::current_exception();
  }
  if (threadId == 0)
    loss_ = state.getLoss();
  ifs.close();
}